

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cc
# Opt level: O0

cmplx __thiscall klogic::mvn::weighted_sum(mvn *this,const_iterator Xbeg,const_iterator Xend)

{
  size_type sVar1;
  difference_type dVar2;
  reference pcVar3;
  undefined7 extraout_var;
  reference __y;
  undefined8 extraout_RDX;
  cmplx cVar4;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_70;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_68;
  complex<double> local_60;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_50;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_48;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_40;
  const_iterator x;
  const_iterator w;
  mvn *this_local;
  const_iterator Xend_local;
  const_iterator Xbeg_local;
  cmplx z;
  
  this_local = (mvn *)Xend._M_current;
  Xend_local = Xbeg;
  sVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                    (&this->weights);
  dVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                      *)&this_local,&Xend_local);
  if (sVar1 == dVar2 + 1U) {
    x = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                  (&this->weights);
    local_40._M_current = Xend_local._M_current;
    local_48 = __gnu_cxx::
               __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
               ::operator++(&x,0);
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
             ::operator*(&local_48);
    Xbeg_local._M_current = *(complex<double> **)pcVar3->_M_value;
    while( true ) {
      local_50._M_current =
           (complex<double> *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                     (&this->weights);
      cVar4._M_value[0] = __gnu_cxx::operator!=(&x,&local_50);
      cVar4._M_value._1_7_ = extraout_var;
      if (!cVar4._M_value[0]) break;
      local_68 = __gnu_cxx::
                 __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                 ::operator++(&x,0);
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
               ::operator*(&local_68);
      local_70 = __gnu_cxx::
                 __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                 ::operator++(&local_40,0);
      __y = __gnu_cxx::
            __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
            ::operator*(&local_70);
      std::operator*(pcVar3,__y);
      std::complex<double>::operator+=((complex<double> *)&Xbeg_local,&local_60);
    }
    cVar4._M_value._8_8_ = extraout_RDX;
    return (cmplx)cVar4._M_value;
  }
  __assert_fail("weights.size() == Xend - Xbeg + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mvn.cc",
                0x18,
                "klogic::cmplx klogic::mvn::weighted_sum(klogic::cvector::const_iterator, klogic::cvector::const_iterator) const"
               );
}

Assistant:

klogic::cmplx klogic::mvn::weighted_sum(
    klogic::cvector::const_iterator Xbeg,
    klogic::cvector::const_iterator Xend) const
{
    assert(weights.size() == Xend - Xbeg + 1);

    cvector::const_iterator w = weights.begin(), x = Xbeg;
    cmplx z = *w++;         // bias

    while (w != weights.end())
        z += (*w++) * (*x++);   // pairwise multiply and summate

    return z;
}